

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_>::disposeImpl
          (DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_> *this,
          void *pointer)

{
  ChainPromiseNode *node;
  
  node = (this->super_OwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_>).first.
         ptr;
  if (node != (ChainPromiseNode *)0x0) {
    (this->super_OwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_>).first.ptr =
         (ChainPromiseNode *)0x0;
    PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  operator_delete(this,0x10);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }